

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void get_split_range<InputData<double,unsigned_long>,WorkerMemory<ImputedData<unsigned_long,double>,double,double>>
               (WorkerMemory<ImputedData<unsigned_long,_double>,_double,_double> *workspace,
               InputData<double,_unsigned_long> *input_data,ModelParams *model_params)

{
  unsigned_long *st;
  int *x;
  double *in_RDX;
  double *unaff_RBX;
  bool *in_RSI;
  long in_RDI;
  bool *unaff_R14;
  unsigned_long *in_stack_00000028;
  double *in_stack_00000030;
  size_t in_stack_00000038;
  size_t in_stack_00000040;
  size_t in_stack_00000048;
  MissingAction in_stack_00000068;
  double *in_stack_00000070;
  double *in_stack_00000078;
  bool *in_stack_00000080;
  undefined8 in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  double *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  MissingAction missing_action;
  size_t *ix_arr;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar2;
  
  missing_action = (MissingAction)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if (*(ulong *)(in_RDI + 0x508) < *(ulong *)(in_RSI + 8)) {
    *(undefined4 *)(in_RDI + 0x510) = 0x1f;
    if (*(size_t *)(in_RSI + 0x68) == 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3dd5aa);
      get_range<double>((size_t *)in_RSI,in_RDX,
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8,missing_action,in_stack_ffffffffffffffb8,unaff_RBX
                        ,unaff_R14);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3dd630);
      get_range<double,unsigned_long>
                ((size_t *)model_params,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                 in_stack_00000030,in_stack_00000028,(unsigned_long *)workspace,in_stack_00000068,
                 in_stack_00000070,in_stack_00000078,in_stack_00000080);
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x510) = 0x20;
    *(size_t *)(in_RDI + 0x508) = *(long *)(in_RDI + 0x508) - *(size_t *)(in_RSI + 8);
    st = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3dd6f3);
    x = (int *)(*(size_t *)(in_RSI + 0x10) +
               *(size_t *)(in_RSI + 0x30) * *(long *)(in_RDI + 0x508) * 4);
    ix_arr = *(size_t **)(in_RDI + 0x58);
    uVar1 = *(undefined4 *)(*(size_t *)(in_RSI + 0x18) + *(long *)(in_RDI + 0x508) * 4);
    uVar2 = *(undefined4 *)(in_RDX + 0x11);
    std::vector<signed_char,_std::allocator<signed_char>_>::data
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x3dd77b);
    get_categs(ix_arr,x,(size_t)st,in_stack_ffffffffffffffa8,
               (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
               (MissingAction)in_stack_ffffffffffffffa0,(char *)CONCAT44(uVar2,uVar1),
               (size_t *)in_RDX,in_RSI);
  }
  return;
}

Assistant:

void get_split_range(WorkerMemory &workspace, InputData &input_data, ModelParams &model_params)
{
    if (workspace.col_chosen < input_data.ncols_numeric)
    {
        workspace.col_type = Numeric;

        if (input_data.Xc_indptr == NULL)
            get_range(workspace.ix_arr.data(), input_data.numeric_data + input_data.nrows * workspace.col_chosen,
                      workspace.st, workspace.end, model_params.missing_action,
                      workspace.xmin, workspace.xmax, workspace.unsplittable);
        else
            get_range(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.col_chosen,
                      input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                      model_params.missing_action, workspace.xmin, workspace.xmax, workspace.unsplittable);
    }

    else
    {
        workspace.col_type = Categorical;
        workspace.col_chosen -= input_data.ncols_numeric;

        get_categs(workspace.ix_arr.data(), input_data.categ_data + input_data.nrows * workspace.col_chosen,
                   workspace.st, workspace.end, input_data.ncat[workspace.col_chosen],
                   model_params.missing_action, workspace.categs.data(), workspace.npresent, workspace.unsplittable);
    }
}